

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O2

void __thiscall QSizeGrip::mousePressEvent(QSizeGrip *this,QMouseEvent *e)

{
  long lVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  undefined1 uVar6;
  ScrollBarPolicy SVar7;
  int iVar8;
  QWidget *this_01;
  QPoint QVar9;
  QWindow *pQVar10;
  long *plVar11;
  QAbstractScrollArea *this_02;
  int iVar12;
  undefined4 uVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QRect QVar17;
  QRect QVar18;
  QPointF QVar19;
  QStringView s;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(e + 0x40) != 1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidget::mousePressEvent(&this->super_QWidget,e);
      return;
    }
    goto LAB_0043b38f;
  }
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  this_01 = qt_sizegrip_topLevelWidget(&this->super_QWidget);
  QVar19 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
  local_58._8_8_ = QVar19.yp;
  local_58.shared = (PrivateShared *)QVar19.xp;
  QVar9 = QPointF::toPoint((QPointF *)&local_58);
  *(QPoint *)(lVar1 + 0x254) = QVar9;
  *(undefined1 *)(lVar1 + 0x27c) = 1;
  uVar3 = *(undefined8 *)&(this_01->data->crect).x2;
  *(undefined8 *)(lVar1 + 0x25c) = *(undefined8 *)&this_01->data->crect;
  *(undefined8 *)(lVar1 + 0x264) = uVar3;
  *(undefined1 *)(lVar1 + 0x290) = 0;
  if (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    pQVar10 = QWidget::windowHandle(this_01);
    if ((pQVar10 != (QWindow *)0x0) &&
       (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x400) == 0)) {
      bVar4 = QWidget::testAttribute_helper(this_01,WA_DontShowOnScreen);
      if (!bVar4) {
        cVar5 = (**(code **)(*(long *)this_01 + 0x88))(this_01);
        if (cVar5 == '\0') {
          QGuiApplication::platformName();
          s.m_data = L"xcb";
          s.m_size = 3;
          bVar4 = QString::contains((QString *)&local_58,s,CaseSensitive);
          if (bVar4) {
LAB_0043b113:
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
          }
          else {
            bVar4 = QWidget::testAttribute_helper(this_01,WA_TranslucentBackground);
            if (bVar4) {
              bVar4 = ::comparesEqual((QString *)&local_58,L"windows");
              if (bVar4) goto LAB_0043b113;
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
            QWidget::windowHandle(this_01);
            plVar11 = (long *)QWindow::handle();
            uVar13 = 0;
            if ((ulong)*(uint *)(lVar1 + 0x278) < 4) {
              uVar13 = *(undefined4 *)(&DAT_00661e70 + (ulong)*(uint *)(lVar1 + 0x278) * 4);
            }
            uVar6 = (**(code **)(*plVar11 + 0x138))(plVar11,uVar13);
            *(undefined1 *)(lVar1 + 0x290) = uVar6;
          }
        }
      }
    }
  }
  if (*(char *)(lVar1 + 0x290) == '\0') {
    if (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      this_00 = *(QWidget **)(*(long *)&this_01->field_0x8 + 0x10);
      this_02 = (QAbstractScrollArea *)
                QtPrivate::qobject_cast_helper<QAbstractScrollArea*,QObject>
                          (*(QObject **)(*(long *)&this_00->field_0x8 + 0x10));
      if (this_02 == (QAbstractScrollArea *)0x0) {
        bVar16 = true;
        bVar4 = true;
      }
      else {
        SVar7 = QAbstractScrollArea::horizontalScrollBarPolicy(this_02);
        bVar16 = SVar7 == ScrollBarAlwaysOff;
        SVar7 = QAbstractScrollArea::verticalScrollBarPolicy(this_02);
        bVar4 = SVar7 == ScrollBarAlwaysOff;
      }
      QVar17 = QWidget::contentsRect(this_00);
    }
    else {
      (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
                (&local_58,QGuiApplicationPrivate::platform_theme,0x25);
      cVar5 = ::QVariant::toBool();
      ::QVariant::~QVariant((QVariant *)&local_58);
      if (cVar5 == '\0') {
        QVar17 = QWidgetPrivate::availableScreenGeometry(this_01);
      }
      else {
        QWidget::screen(this_01);
        QVar17 = (QRect)QScreen::availableVirtualGeometry();
      }
      bVar16 = true;
      bVar4 = true;
    }
    QVar18 = QWidget::frameGeometry(this_01);
    pQVar2 = this_01->data;
    iVar15 = (pQVar2->crect).y1.m_i;
    iVar14 = iVar15 - QVar18.y1.m_i;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    iVar15 = (QVar18.y2.m_i.m_i + iVar15) - (QVar18.y1.m_i.m_i + (pQVar2->crect).y2.m_i + iVar14);
    if (iVar15 < 1) {
      iVar15 = 0;
    }
    iVar8 = (((QVar18.x2.m_i.m_i - QVar18.x1.m_i) - (pQVar2->crect).x2.m_i) + (pQVar2->crect).x1.m_i
            ) / 2;
    iVar12 = 0;
    if (0 < iVar8) {
      iVar12 = iVar8;
    }
    if ((*(uint *)(lVar1 + 0x278) & 0xfffffffe) == 2) {
      iVar8 = 0x7fffffff;
      if (bVar4) {
        iVar8 = QVar17.y2.m_i.m_i - (iVar15 + *(int *)(lVar1 + 0x268));
      }
    }
    else {
      iVar8 = -0x7fffffff;
      if (bVar4) {
        iVar8 = (iVar14 + QVar17.y1.m_i.m_i) - *(int *)(lVar1 + 0x260);
      }
    }
    *(int *)(lVar1 + 0x274) = iVar8;
    if ((*(uint *)(lVar1 + 0x278) & 0xfffffffd) == 0) {
      if (bVar16) {
        *(int *)(lVar1 + 0x270) = (iVar12 + QVar17.x1.m_i.m_i) - *(int *)(lVar1 + 0x25c);
      }
      else {
        *(undefined4 *)(lVar1 + 0x270) = 0x80000001;
      }
    }
    else if (bVar16) {
      *(int *)(lVar1 + 0x270) = QVar17.x2.m_i.m_i - (iVar12 + *(int *)(lVar1 + 0x264));
    }
    else {
      *(undefined4 *)(lVar1 + 0x270) = 0x7fffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0043b38f:
  __stack_chk_fail();
}

Assistant:

void QSizeGrip::mousePressEvent(QMouseEvent * e)
{
    if (e->button() != Qt::LeftButton) {
        QWidget::mousePressEvent(e);
        return;
    }

    Q_D(QSizeGrip);
    QWidget *tlw = qt_sizegrip_topLevelWidget(this);
    d->p = e->globalPosition().toPoint();
    d->gotMousePress = true;
    d->r = tlw->geometry();

    // Does the platform provide size grip support?
    d->m_platformSizeGrip = false;
    if (tlw->isWindow()
        && tlw->windowHandle()
        && !(tlw->windowFlags() & Qt::X11BypassWindowManagerHint)
        && !tlw->testAttribute(Qt::WA_DontShowOnScreen)
        && !tlw->hasHeightForWidth()
        && usePlatformSizeGrip(tlw)) {
        QPlatformWindow *platformWindow = tlw->windowHandle()->handle();
        const Qt::Edges edges = edgesFromCorner(d->m_corner);
        d->m_platformSizeGrip = platformWindow->startSystemResize(edges);
    }

    if (d->m_platformSizeGrip)
        return;

    // Find available desktop/workspace geometry.
    QRect availableGeometry;
    bool hasVerticalSizeConstraint = true;
    bool hasHorizontalSizeConstraint = true;
    if (tlw->isWindow()) {
        if (QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::InteractiveResizeAcrossScreens).toBool())
            availableGeometry = tlw->screen()->availableVirtualGeometry();
        else
            availableGeometry = QWidgetPrivate::availableScreenGeometry(tlw);
    }
    else {
        const QWidget *tlwParent = tlw->parentWidget();
        // Check if tlw is inside QAbstractScrollArea/QScrollArea.
        // If that's the case tlw->parentWidget() will return the viewport
        // and tlw->parentWidget()->parentWidget() will return the scroll area.
#if QT_CONFIG(scrollarea)
        QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(tlwParent->parentWidget());
        if (scrollArea) {
            hasHorizontalSizeConstraint = scrollArea->horizontalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
            hasVerticalSizeConstraint = scrollArea->verticalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
        }
#endif // QT_CONFIG(scrollarea)
        availableGeometry = tlwParent->contentsRect();
    }

    // Find frame geometries, title bar height, and decoration sizes.
    const QRect frameGeometry = tlw->frameGeometry();
    const int titleBarHeight = qMax(tlw->geometry().y() - frameGeometry.y(), 0);
    const int bottomDecoration = qMax(frameGeometry.height() - tlw->height() - titleBarHeight, 0);
    const int leftRightDecoration = qMax((frameGeometry.width() - tlw->width()) / 2, 0);

    // Determine dyMax depending on whether the sizegrip is at the bottom
    // of the widget or not.
    if (d->atBottom()) {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.bottom() - d->r.bottom() - bottomDecoration;
        else
            d->dyMax = INT_MAX;
    } else {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.y() - d->r.y() + titleBarHeight;
        else
            d->dyMax = -INT_MAX;
    }

    // In RTL mode, the size grip is to the left; find dxMax from the desktop/workspace
    // geometry, the size grip geometry and the width of the decoration.
    if (d->atLeft()) {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.x() - d->r.x() + leftRightDecoration;
        else
            d->dxMax = -INT_MAX;
    } else {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.right() - d->r.right() - leftRightDecoration;
        else
            d->dxMax = INT_MAX;
    }
}